

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clients_map.c
# Opt level: O0

piga_status piga_clients_map_remove(piga_clients_map *map,int shm_key)

{
  int iVar1;
  piga_event_queue *ppVar2;
  ulong local_28;
  size_t i;
  int shm_key_local;
  piga_clients_map *map_local;
  
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    if ((map->items[local_28].queue == (piga_event_queue *)0x0) &&
       (iVar1 = piga_clients_map_item_get_shm_key(map->items + local_28), iVar1 == shm_key)) {
      ppVar2 = piga_clients_map_item_get_queue(map->items + local_28);
      piga_event_queue_disconnect_from_shm(ppVar2);
      map->items[local_28].queue = (piga_event_queue *)0x0;
      map->items[local_28].shm_key = 0;
    }
  }
  return map_local._4_4_;
}

Assistant:

piga_status piga_clients_map_remove(piga_clients_map* map, int shm_key)
{
    for(size_t i = 0; i < PIGA_CLIENTS_MAP_ITEM_NUMBER; ++i) {
        if(map->items[i].queue == 0) {
            if(piga_clients_map_item_get_shm_key(&map->items[i]) == shm_key) {
                // Disconnect the queue
                piga_event_queue_disconnect_from_shm(piga_clients_map_item_get_queue(&map->items[i]));
                
                // Remove the item from the map.
                map->items[i].queue = 0;
                map->items[i].shm_key = 0;
            }
        }
    }
}